

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_2d_mixed<30ul,1ul>(void)

{
  int iVar1;
  int iVar2;
  tuple<int,_int> *ptVar3;
  value_type vVar4;
  value_type vVar5;
  ulong uVar6;
  size_type sVar7;
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var9;
  reference pvVar10;
  tuple<int,_int> *local_c8;
  tuple<int,_int> *local_c0;
  size_type local_b8;
  unsigned_long local_b0;
  value_type true_idx;
  int i;
  int j;
  tuple<int,_int> *dptr;
  allocator<std::tuple<int,_int>_> local_81;
  undefined1 local_80 [8];
  vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> data;
  size_type local_60;
  unsigned_long local_58;
  size_type local_50;
  int local_44;
  size_type local_40;
  int local_34;
  size_type local_30;
  bool local_22;
  bool local_21;
  dimensions<18446744073709551615UL,_1UL> local_20;
  undefined1 local_18 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL,_1UL>::dimensions<unsigned_long,_nullptr>
            (&local_20,0x1e);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
              *)local_18,local_20);
  local_21 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::is_regular();
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xa6,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_21,&local_22);
  local_30 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
                       *)local_18,0);
  local_34 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xa8,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_30,&local_34);
  local_40 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
                       *)local_18,1);
  local_44 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xa9,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_40,&local_44);
  local_50 = std::experimental::dimensions<18446744073709551615UL,_1UL>::size
                       ((dimensions<18446744073709551615UL,_1UL> *)local_18);
  local_58 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xab,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_50,&local_58);
  local_60 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL,_1UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_0UL>_>
                     *)local_18);
  data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xac,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_60,
             (unsigned_long *)
             &data.super__Vector_base<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  vVar4 = std::experimental::dimensions<18446744073709551615UL,_1UL>::operator[]<int>
                    ((dimensions<18446744073709551615UL,_1UL> *)local_18,0);
  vVar5 = std::experimental::dimensions<18446744073709551615UL,_1UL>::operator[]<int>
                    ((dimensions<18446744073709551615UL,_1UL> *)local_18,1);
  std::allocator<std::tuple<int,_int>_>::allocator(&local_81);
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_80,
             vVar4 * vVar5,&local_81);
  std::allocator<std::tuple<int,_int>_>::~allocator(&local_81);
  _i = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::data
                 ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_80);
  true_idx._4_4_ = 0;
  while( true ) {
    uVar6 = (ulong)true_idx._4_4_;
    vVar4 = std::experimental::dimensions<18446744073709551615UL,_1UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL,_1UL> *)local_18,1);
    if (vVar4 <= uVar6) break;
    true_idx._0_4_ = 0;
    while( true ) {
      uVar6 = (ulong)(int)true_idx;
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_1UL>::operator[]<int>
                        ((dimensions<18446744073709551615UL,_1UL> *)local_18,0);
      if (vVar4 <= uVar6) break;
      vVar4 = std::experimental::dimensions<18446744073709551615UL,_1UL>::operator[]<int>
                        ((dimensions<18446744073709551615UL,_1UL> *)local_18,1);
      local_b0 = vVar4 * (long)(int)true_idx + (long)true_idx._4_4_;
      local_b8 = std::experimental::
                 layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                 ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                   *)local_18,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xb7,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_b8,&local_b0);
      ptVar3 = _i;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      local_c0 = ptVar3 + sVar7;
      local_c8 = _i + local_b0;
      boost::detail::test_eq_impl<std::tuple<int,int>*,std::tuple<int,int>*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xb9,"void test_2d_mixed() [X = 30UL, Y = 1UL]",&local_c0,&local_c8);
      ptVar3 = _i;
      iVar1 = (int)true_idx;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      p_Var8 = std::get<0ul,int,int>(ptVar3 + sVar7);
      ptVar3 = _i;
      iVar2 = true_idx._4_4_;
      *p_Var8 = iVar1;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      p_Var9 = std::get<1ul,int,int>(ptVar3 + sVar7);
      ptVar3 = _i;
      *p_Var9 = iVar2;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      p_Var8 = std::get<0ul,int,int>(ptVar3 + sVar7);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(dptr[l.index(i, j)]))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xbe,"void test_2d_mixed() [X = 30UL, Y = 1UL]",p_Var8,(int *)&true_idx);
      ptVar3 = _i;
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      p_Var9 = std::get<1ul,int,int>(ptVar3 + sVar7);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(dptr[l.index(i, j)]))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xbf,"void test_2d_mixed() [X = 30UL, Y = 1UL]",p_Var9,
                 (int *)((long)&true_idx + 4));
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      pvVar10 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                          ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                           local_80,sVar7);
      p_Var8 = std::get<0ul,int,int>(pvVar10);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<0>(data.at(l.index(i, j))))","i",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xc2,"void test_2d_mixed() [X = 30UL, Y = 1UL]",p_Var8,(int *)&true_idx);
      sVar7 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615ul,1ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,0ul>>
                                *)local_18,(int)true_idx,true_idx._4_4_);
      pvVar10 = std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::at
                          ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)
                           local_80,sVar7);
      p_Var9 = std::get<1ul,int,int>(pvVar10);
      boost::detail::test_eq_impl<int,int>
                ("(std::get<1>(data.at(l.index(i, j))))","j",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                 ,0xc3,"void test_2d_mixed() [X = 30UL, Y = 1UL]",p_Var9,
                 (int *)((long)&true_idx + 4));
      true_idx._0_4_ = (int)true_idx + 1;
    }
    true_idx._4_4_ = true_idx._4_4_ + 1;
  }
  std::vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int>,_std::allocator<std::tuple<int,_int>_>_> *)local_80);
  return;
}

Assistant:

void test_2d_mixed()
{ // {{{
    layout_mapping_right<
        dimensions<dyn, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{{X}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    vector<tuple<int, int> > data(l[0] * l[1]);
    tuple<int, int>* dptr = data.data();

    // Set all elements to a unique value.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j)]) = i;
        std::get<1>(dptr[l.index(i, j)]) = j;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j)])), j); 

        // Bounds-checking.
        BOOST_TEST_EQ((std::get<0>(data.at(l.index(i, j)))), i); 
        BOOST_TEST_EQ((std::get<1>(data.at(l.index(i, j)))), j); 
    }
}